

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode cr_mime_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                     _Bool *peos)

{
  int *piVar1;
  void *pvVar2;
  curl_mimepart *pcVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  ulong uVar6;
  size_t len;
  ssize_t sVar7;
  long lVar8;
  curl_mimepart *part;
  char *fmt;
  curl_mimepart *part_1;
  _Bool hasread_1;
  ulong local_160;
  Curl_easy *local_158;
  _Bool *local_150;
  ulong *local_148;
  bufq *local_140;
  char tmp [256];
  
  pvVar2 = reader->ctx;
  if ((*(byte *)((long)pvVar2 + 0x80) & 2) != 0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) is errored -> %d, eos=0",blen,
                    (ulong)*(uint *)((long)pvVar2 + 0x38));
    }
    *pnread = 0;
    *peos = false;
    return *(CURLcode *)((long)pvVar2 + 0x38);
  }
  if ((*(byte *)((long)pvVar2 + 0x80) & 1) != 0) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) seen eos -> 0, eos=1",blen);
    }
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  lVar8 = *(long *)((long)pvVar2 + 0x28);
  if (lVar8 < 0) {
LAB_00142419:
    local_140 = (bufq *)((long)pvVar2 + 0x40);
    _Var5 = Curl_bufq_is_empty(local_140);
    if (_Var5) {
      if (blen < 5) goto LAB_00142555;
      pcVar3 = *(curl_mimepart **)((long)pvVar2 + 0x20);
      local_158 = data;
      local_150 = peos;
      local_148 = pnread;
      do {
        tmp._0_4_ = tmp._0_4_ & 0xffffff00;
        len = readback_part(pcVar3,buf,blen,(_Bool *)tmp);
        data = local_158;
        peos = local_150;
        pnread = local_148;
        local_160 = blen;
      } while (len == 0xfffffffffffffffe);
    }
    else {
LAB_00142642:
      tmp[0] = '\0';
      tmp[1] = '\0';
      tmp[2] = '\0';
      tmp[3] = '\0';
      local_160 = blen;
      len = Curl_bufq_read(local_140,(uchar *)buf,blen,(CURLcode *)tmp);
      if ((long)len < 0) {
        *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
        _hasread_1 = tmp._0_4_;
LAB_00142679:
        *(CURLcode *)((long)pvVar2 + 0x38) = _hasread_1;
        return _hasread_1;
      }
    }
  }
  else {
    uVar6 = lVar8 - *(long *)((long)pvVar2 + 0x30);
    if (uVar6 != 0 && *(long *)((long)pvVar2 + 0x30) <= lVar8) {
      if ((long)uVar6 < (long)blen) {
        blen = uVar6;
      }
      goto LAB_00142419;
    }
    local_140 = (bufq *)((long)pvVar2 + 0x40);
    _Var5 = Curl_bufq_is_empty(local_140);
    blen = 0;
    if (!_Var5) goto LAB_00142642;
LAB_00142555:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_mime_read(len=%zu), small read, using tmp",blen);
    }
    pcVar3 = *(curl_mimepart **)((long)pvVar2 + 0x20);
    local_160 = blen;
    local_158 = data;
    local_150 = peos;
    local_148 = pnread;
    do {
      _hasread_1 = _hasread_1 & 0xffffff00;
      len = readback_part(pcVar3,tmp,0x100,&hasread_1);
    } while (len == 0xfffffffffffffffe);
    data = local_158;
    peos = local_150;
    pnread = local_148;
    if (len < 0x101) {
      _hasread_1 = CURLE_OK;
      sVar7 = Curl_bufq_write(local_140,(uchar *)tmp,len,(CURLcode *)&hasread_1);
      pnread = local_148;
      peos = local_150;
      data = local_158;
      if ((sVar7 < 0) ||
         (len = Curl_bufq_read(local_140,(uchar *)buf,local_160,(CURLcode *)&hasread_1),
         (long)len < 0)) {
        *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
        goto LAB_00142679;
      }
    }
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_mime_read(len=%zu), mime_read() -> %zd",local_160,len);
  }
  uVar6 = local_160;
  if ((long)len < 0x10000000) {
    if (len + 2 < 2) {
      fmt = "read error getting mime data";
      goto LAB_001426f6;
    }
    if (len != 0) goto LAB_00142805;
    if ((-1 < *(long *)((long)pvVar2 + 0x28)) &&
       (*(long *)((long)pvVar2 + 0x30) < *(long *)((long)pvVar2 + 0x28))) {
      Curl_failf(data,"client mime read EOF fail, only %ld/%ld of needed bytes read");
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = true;
    *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 1;
  }
  else {
    if (len == 0x10000000) {
      Curl_failf(data,"operation aborted by callback");
      *pnread = 0;
      *peos = false;
      *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
      *(undefined4 *)((long)pvVar2 + 0x38) = 0x2a;
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if (len == 0x10000001) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        Curl_trc_read(data,"cr_mime_read(len=%zu), paused by callback",local_160);
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 0x20;
      *pnread = 0;
      *peos = false;
      goto LAB_0014287e;
    }
LAB_00142805:
    if (local_160 < len) {
      fmt = "read function returned funny value";
LAB_001426f6:
      Curl_failf(data,fmt);
      *pnread = 0;
      *peos = false;
      *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
      *(undefined4 *)((long)pvVar2 + 0x38) = 0x1a;
      return CURLE_READ_ERROR;
    }
    lVar8 = *(long *)((long)pvVar2 + 0x30) + len;
    *(long *)((long)pvVar2 + 0x30) = lVar8;
    if (-1 < *(long *)((long)pvVar2 + 0x28)) {
      *(byte *)((long)pvVar2 + 0x80) =
           *(byte *)((long)pvVar2 + 0x80) & 0xfe | *(long *)((long)pvVar2 + 0x28) <= lVar8;
    }
    *pnread = len;
    *peos = (_Bool)(*(byte *)((long)pvVar2 + 0x80) & 1);
  }
  if (data == (Curl_easy *)0x0) {
    return CURLE_OK;
  }
LAB_0014287e:
  if (((data->set).field_0x89f & 0x40) == 0) {
    return CURLE_OK;
  }
  pcVar4 = (data->state).feat;
  if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
    return CURLE_OK;
  }
  if (0 < Curl_trc_feat_read.log_level) {
    Curl_trc_read(data,"cr_mime_read(len=%zu, total=%ld, read=%ld) -> %d, %zu, %d",uVar6,
                  *(undefined8 *)((long)pvVar2 + 0x28),*(undefined8 *)((long)pvVar2 + 0x30),0,
                  *pnread,(ulong)*peos);
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_mime_read(struct Curl_easy *data,
                             struct Curl_creader *reader,
                             char *buf, size_t blen,
                             size_t *pnread, bool *peos)
{
  struct cr_mime_ctx *ctx = reader->ctx;
  size_t nread;
  char tmp[256];


  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) is errored -> %d, eos=0",
                  blen, ctx->error_result);
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) seen eos -> 0, eos=1", blen);
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }

  if(!Curl_bufq_is_empty(&ctx->tmpbuf)) {
    CURLcode result = CURLE_OK;
    ssize_t n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen,
                               &result);
    if(n < 0) {
      ctx->errored = TRUE;
      ctx->error_result = result;
      return result;
    }
    nread = (size_t)n;
  }
  else if(blen <= 4) {
    /* Curl_mime_read() may go into an infinite loop when reading
     * via a base64 encoder, as it stalls when the read buffer is too small
     * to contain a complete 3 byte encoding. Read into a larger buffer
     * and use that until empty. */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), small read, using tmp", blen);
    nread = Curl_mime_read(tmp, 1, sizeof(tmp), ctx->part);
    if(nread <= sizeof(tmp)) {
      CURLcode result = CURLE_OK;
      ssize_t n = Curl_bufq_write(&ctx->tmpbuf, (unsigned char *)tmp, nread,
                                  &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      /* stored it, read again */
      n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen, &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      nread = (size_t)n;
    }
  }
  else
    nread = Curl_mime_read(buf, 1, blen, ctx->part);

  CURL_TRC_READ(data, "cr_mime_read(len=%zu), mime_read() -> %zd",
                blen, nread);

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client mime read EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T
            " of needed bytes read", ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), paused by callback", blen);
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  case STOP_FILLING:
  case READ_ERROR:
    failf(data, "read error getting mime data");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_READ_ERROR;
    return CURLE_READ_ERROR;

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }

  CURL_TRC_READ(data, "cr_mime_read(len=%zu, total=%" FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, %zu, %d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK, *pnread, *peos);
  return CURLE_OK;
}